

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVehicle.cpp
# Opt level: O0

void __thiscall
OpenSteer::SimpleVehicle::annotationVelocityAcceleration
          (SimpleVehicle *this,float maxLengthA,float maxLengthV)

{
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  Color vColor;
  Color aColor;
  Vec3 *p;
  float vScale;
  float aScale;
  float desat;
  Color *in_stack_fffffffffffffec8;
  float gValue;
  float rValue;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_00;
  Color local_68;
  Color local_58;
  _func_int **local_48;
  float local_40;
  undefined1 local_38 [28];
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  
  local_14 = 0.4;
  local_10 = in_XMM1_Da;
  local_18 = (float)(**(code **)(*in_RDI + 0xf0))();
  local_18 = in_XMM0_Da / local_18;
  fVar1 = (float)(**(code **)(*in_RDI + 0x100))();
  local_1c = local_10 / fVar1;
  local_48 = (_func_int **)(**(code **)(*in_RDI + 0x40))();
  local_38._16_8_ = local_38;
  gValue = 0.4;
  rValue = 1.0;
  local_40 = fVar1;
  local_38._0_8_ = local_48;
  local_38._8_4_ = fVar1;
  Color::Color(&local_58,0.4,0.4,1.0,1.0);
  Color::Color(&local_68,rValue,gValue,rValue,rValue);
  this_00 = (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
            local_38._16_8_;
  (**(code **)(*in_RDI + 0xd0))();
  Vec3::operator*((Vec3 *)this_00,rValue);
  Vec3::operator+((Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,gValue));
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::annotationLine
            (this_00,(Vec3 *)CONCAT44(rValue,gValue),(Vec3 *)CONCAT44(local_10,in_XMM0_Da),
             in_stack_fffffffffffffec8);
  Vec3::operator*((Vec3 *)this_00,rValue);
  Vec3::operator+((Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,gValue));
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::annotationLine
            (this_00,(Vec3 *)CONCAT44(rValue,gValue),(Vec3 *)CONCAT44(local_10,in_XMM0_Da),
             in_stack_fffffffffffffec8);
  return;
}

Assistant:

void 
OpenSteer::SimpleVehicle::annotationVelocityAcceleration (float maxLengthA, 
                                                          float maxLengthV)
{
    const float desat = 0.4f;
    const float aScale = maxLengthA / maxForce ();
    const float vScale = maxLengthV / maxSpeed ();
    const Vec3& p = position();
    const Color aColor (desat, desat, 1); // bluish
    const Color vColor (    1, desat, 1); // pinkish

    annotationLine (p, p + (velocity ()           * vScale), vColor);
    annotationLine (p, p + (_smoothedAcceleration * aScale), aColor);
}